

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall
NavierStokesBase::computeNewDt
          (NavierStokesBase *this,int finest_level,int param_2,
          Vector<int,_std::allocator<int>_> *n_cycle,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *param_4,
          Vector<double,_std::allocator<double>_> *dt_min,
          Vector<double,_std::allocator<double>_> *dt_level,Real stop_time,int post_regrid_flag)

{
  ostringstream *this_00;
  ostringstream *poVar1;
  pointer pSVar2;
  pointer piVar3;
  TimeCenter TVar4;
  NavierStokesBase *pNVar5;
  pointer pdVar6;
  pointer pdVar7;
  int iVar8;
  ulong uVar9;
  Vector<int,_std::allocator<int>_> *pVVar10;
  ulong uVar11;
  double extraout_XMM0_Qa;
  double dVar12;
  Real RVar13;
  double dVar14;
  char local_1d1;
  Vector<int,_std::allocator<int>_> *local_1d0;
  Real local_1c8;
  ulong local_1c0;
  Print local_1b8;
  
  if (0 < (this->super_AmrLevel).level) {
    return;
  }
  local_1d0 = n_cycle;
  local_1c8 = stop_time;
  if (-1 < finest_level) {
    uVar11 = 0;
    do {
      pNVar5 = getLevel(this,(int)uVar11);
      pdVar6 = (dt_min->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      (*(pNVar5->super_AmrLevel)._vptr_AmrLevel[0x31])();
      dVar12 = pdVar6[uVar11];
      dVar14 = extraout_XMM0_Qa;
      if (dVar12 <= extraout_XMM0_Qa) {
        dVar14 = dVar12;
      }
      (dt_min->super_vector<double,_std::allocator<double>_>).
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar11] = dVar14;
      uVar11 = uVar11 + 1;
    } while (finest_level + 1 != uVar11);
  }
  if (0.0 < fixed_dt) {
LAB_0024ddb8:
    if (-1 < finest_level) {
      dVar12 = 1e+100;
      iVar8 = 1;
      uVar11 = 0;
      do {
        iVar8 = iVar8 * (local_1d0->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar11];
        dVar14 = (double)iVar8 *
                 (dt_min->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar11];
        if (dVar12 <= dVar14) {
          dVar14 = dVar12;
        }
        dVar12 = dVar14;
        uVar11 = uVar11 + 1;
        pVVar10 = local_1d0;
      } while (finest_level + 1 != uVar11);
      goto LAB_0024de0a;
    }
  }
  else if (post_regrid_flag == 1) {
    if (-1 < finest_level) {
      pdVar6 = (dt_min->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar7 = (dt_level->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar11 = 0;
      do {
        dVar12 = pdVar7[uVar11];
        dVar14 = pdVar6[uVar11];
        if (dVar14 <= dVar12) {
          dVar12 = dVar14;
        }
        pdVar6[uVar11] = dVar12;
        uVar11 = uVar11 + 1;
      } while (finest_level + 1 != uVar11);
      goto LAB_0024ddb8;
    }
  }
  else if (-1 < finest_level) {
    this_00 = &local_1b8.ss;
    uVar11 = (ulong)(finest_level + 1);
    pdVar6 = (dt_min->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar7 = (dt_level->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar9 = 0;
    iVar8 = verbose;
    local_1c0 = uVar11;
    do {
      if (iVar8 == 0) {
        iVar8 = 0;
      }
      else if (pdVar7[uVar9] * change_max < pdVar6[uVar9]) {
        local_1b8.os = amrex::OutStream();
        local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
        local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"NavierStokesBase::compute_new_dt : limiting dt at level ",
                   0x38);
        std::ostream::operator<<(this_00,(int)uVar9);
        local_1d1 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_1d1,1);
        amrex::Print::~Print(&local_1b8);
        local_1b8.os = amrex::OutStream();
        local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
        local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
        poVar1 = &local_1b8.ss;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," ... new dt computed: ",0x16);
        std::ostream::_M_insert<double>
                  ((dt_min->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9]);
        local_1d1 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_1d1,1);
        amrex::Print::~Print(&local_1b8);
        local_1b8.os = amrex::OutStream();
        local_1b8.rank = *(int *)(DAT_0071a620 + -0x30);
        local_1b8.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
        poVar1 = &local_1b8.ss;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," ... but limiting to: ",0x16);
        std::ostream::_M_insert<double>
                  (change_max *
                   (dt_level->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
        std::ostream::_M_insert<double>(change_max);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," * ",3);
        std::ostream::_M_insert<double>
                  ((dt_level->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9]);
        local_1d1 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_1d1,1);
        amrex::Print::~Print(&local_1b8);
        pdVar6 = (dt_min->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar7 = (dt_level->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar11 = local_1c0;
        iVar8 = verbose;
      }
      dVar12 = change_max * pdVar7[uVar9];
      if (pdVar6[uVar9] <= change_max * pdVar7[uVar9]) {
        dVar12 = pdVar6[uVar9];
      }
      pdVar6[uVar9] = dVar12;
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
    goto LAB_0024ddb8;
  }
  dVar12 = 1e+100;
  pVVar10 = local_1d0;
LAB_0024de0a:
  pSVar2 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1d0 = (Vector<int,_std::allocator<int>_> *)dVar12;
  TVar4 = amrex::StateDescriptor::timeType(pSVar2->desc);
  if (TVar4 == Point) {
    RVar13 = (pSVar2->new_time).stop;
  }
  else {
    RVar13 = ((pSVar2->new_time).start + (pSVar2->new_time).stop) * 0.5;
  }
  if ((0.0 <= local_1c8) && ((double)local_1d0 * -0.0001 + local_1c8 < (double)local_1d0 + RVar13))
  {
    local_1d0 = (Vector<int,_std::allocator<int>_> *)(local_1c8 - RVar13);
  }
  if (-1 < finest_level) {
    piVar3 = (pVVar10->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    pdVar6 = (dt_level->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar8 = 1;
    uVar11 = 0;
    do {
      iVar8 = iVar8 * piVar3[uVar11];
      pdVar6[uVar11] = (double)local_1d0 / (double)iVar8;
      uVar11 = uVar11 + 1;
    } while (finest_level + 1 != uVar11);
  }
  return;
}

Assistant:

void
NavierStokesBase::computeNewDt (int                   finest_level,
				int                   /*sub_cycle*/,
				Vector<int>&           n_cycle,
				const Vector<IntVect>& /*ref_ratio*/,
				Vector<Real>&          dt_min,
				Vector<Real>&          dt_level,
				Real                  stop_time,
				int                   post_regrid_flag)
{
    //
    // We are at the start of a coarse grid timecycle.
    // Compute the timesteps for the next iteration.
    //
    if (level > 0)
        return;

    int i;

    Real dt_0     = 1.0e+100;
    int  n_factor = 1;
    for (i = 0; i <= finest_level; i++)
    {
        NavierStokesBase& adv_level = getLevel(i);
        dt_min[i] = std::min(dt_min[i],adv_level.estTimeStep());
    }

    if (fixed_dt <= 0.0)
    {
       if (post_regrid_flag == 1)
       {
          //
          // Limit dt's by pre-regrid dt
          //
          for (i = 0; i <= finest_level; i++)
          {
              dt_min[i] = std::min(dt_min[i],dt_level[i]);
          }
       }
       else
       {
          //
          // Limit dt's by change_max * old dt
          //
          for (i = 0; i <= finest_level; i++)
          {
	    if (verbose)
                 if (dt_min[i] > change_max*dt_level[i])
                 {
                     amrex::Print() << "NavierStokesBase::compute_new_dt : limiting dt at level "
				    << i << '\n';
                     amrex::Print() << " ... new dt computed: " << dt_min[i]
				    << '\n';
                     amrex::Print() << " ... but limiting to: "
				    << change_max * dt_level[i] << " = " << change_max
				    << " * " << dt_level[i] << '\n';
                 }
             dt_min[i] = std::min(dt_min[i],change_max*dt_level[i]);
          }
       }
    }

    //
    // Find the minimum over all levels
    //
    for (i = 0; i <= finest_level; i++)
    {
        n_factor *= n_cycle[i];
        dt_0      = std::min(dt_0,n_factor*dt_min[i]);
    }

    //
    // Limit dt's by the value of stop_time.
    //
    const Real eps      = 0.0001*dt_0;
    const Real cur_time = state[State_Type].curTime();
    if (stop_time >= 0.0)
    {
        if ((cur_time + dt_0) > (stop_time - eps))
            dt_0 = stop_time - cur_time;
    }

    //
    // Set dt at each level of refinement
    //
    n_factor = 1;
    for (i = 0; i <= finest_level; i++)
    {
        n_factor   *= n_cycle[i];
        dt_level[i] = dt_0/( (Real)n_factor );
    }
}